

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStream *pAVar1;
  _func_int **pp_Var2;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> writeBuffer;
  _func_int **local_38;
  _func_int **pp_Stack_30;
  
  if (__n == 0) {
    heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
    (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = local_38;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Stack_30;
  }
  else {
    pAVar1 = (((AsyncPipe *)CONCAT44(in_register_00000034,__fd))->state).ptr;
    if (pAVar1 == (AsyncIoStream *)0x0) {
      pp_Var2 = (_func_int **)operator_new(0x1d0);
      pp_Var2[1] = (_func_int *)0x0;
      *pp_Var2 = (_func_int *)&PTR_onReady_0062a838;
      pp_Var2[2] = (_func_int *)&PTR_fulfill_0062a880;
      *(undefined1 *)(pp_Var2 + 3) = 0;
      *(undefined1 *)(pp_Var2 + 0x2f) = 0;
      *(undefined1 *)(pp_Var2 + 0x30) = 1;
      local_38 = (_func_int **)0x0;
      pp_Stack_30 = (_func_int **)0x0;
      writeBuffer.size_ = __n;
      writeBuffer.ptr = (uchar *)__buf;
      BlockedWrite::BlockedWrite
                ((BlockedWrite *)(pp_Var2 + 0x31),(PromiseFulfiller<void> *)(pp_Var2 + 2),
                 (AsyncPipe *)CONCAT44(in_register_00000034,__fd),writeBuffer,
                 (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>)ZEXT816(0));
      (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
           (_func_int **)
           &kj::_::
            HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>>
            ::instance;
      (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var2;
    }
    else {
      (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
                (this,&pAVar1->super_AsyncOutputStream,__buf,__n);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(const void* buffer, size_t size) override {
    if (size == 0) {
      return READY_NOW;
    } else KJ_IF_MAYBE(s, state) {
      return s->write(buffer, size);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, arrayPtr(reinterpret_cast<const byte*>(buffer), size), nullptr);
    }
  }